

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

int Hsh_VecManAdd(Hsh_VecMan_t *p,Vec_Int_t *vVec)

{
  uint Entry;
  int iVar1;
  int iVar2;
  Vec_Int_t *vVec_00;
  int *piVar3;
  Hsh_VecObj_t *pHVar4;
  Vec_Int_t *pVVar5;
  
  pVVar5 = p->vTable;
  iVar1 = pVVar5->nSize;
  if (iVar1 < p->vMap->nSize) {
    iVar1 = Abc_PrimeCudd(iVar1 * 2);
    Vec_IntFill(pVVar5,iVar1,-1);
    for (iVar1 = 0; pVVar5 = p->vTable, iVar1 < p->vMap->nSize; iVar1 = iVar1 + 1) {
      vVec_00 = Hsh_VecReadEntry(p,iVar1);
      iVar2 = Hsh_VecManHash(vVec_00,p->vTable->nSize);
      piVar3 = Vec_IntEntryP(pVVar5,iVar2);
      iVar2 = *piVar3;
      pHVar4 = Hsh_VecObj(p,iVar1);
      pHVar4->iNext = iVar2;
      *piVar3 = iVar1;
    }
    iVar1 = pVVar5->nSize;
  }
  iVar1 = Hsh_VecManHash(vVec,iVar1);
  piVar3 = Vec_IntEntryP(pVVar5,iVar1);
  while( true ) {
    pHVar4 = Hsh_VecObj(p,*piVar3);
    if (pHVar4 == (Hsh_VecObj_t *)0x0) {
      pVVar5 = p->vMap;
      *piVar3 = pVVar5->nSize;
      Entry = p->vData->nSize;
      if ((Entry & 1) == 0) {
        Vec_IntPush(pVVar5,Entry);
        Vec_IntPush(p->vData,vVec->nSize);
        Vec_IntPush(p->vData,-1);
        for (iVar1 = 0; iVar1 < vVec->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(vVec,iVar1);
          Vec_IntPush(p->vData,iVar2);
        }
        if ((vVec->nSize & 1U) != 0) {
          Vec_IntPush(p->vData,-1);
        }
        return p->vMap->nSize + -1;
      }
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHsh.h"
                    ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    if ((pHVar4->nSize == vVec->nSize) &&
       (iVar1 = bcmp(pHVar4 + 1,vVec->pArray,(long)pHVar4->nSize << 2), iVar1 == 0)) break;
    piVar3 = &pHVar4->iNext;
  }
  return *piVar3;
}

Assistant:

static inline int Hsh_VecManAdd( Hsh_VecMan_t * p, Vec_Int_t * vVec )
{
    Hsh_VecObj_t * pObj;
    int i, Ent, * pPlace;
    if ( Vec_IntSize(p->vMap) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_IntSize(p->vMap); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(Hsh_VecReadEntry(p, i), Vec_IntSize(p->vTable)) );
            Hsh_VecObj(p, i)->iNext = *pPlace; *pPlace = i;
        }
    }
    pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(vVec, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_VecObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( pObj->nSize == Vec_IntSize(vVec) && !memcmp( pObj->pArray, Vec_IntArray(vVec), sizeof(int) * (size_t)pObj->nSize ) )
            return *pPlace;
    *pPlace = Vec_IntSize(p->vMap);
    assert( Vec_IntSize(p->vData) % 2 == 0 );
    Vec_IntPush( p->vMap, Vec_IntSize(p->vData) );
    Vec_IntPush( p->vData, Vec_IntSize(vVec) );
    Vec_IntPush( p->vData, -1 );
    Vec_IntForEachEntry( vVec, Ent, i )
        Vec_IntPush( p->vData, Ent );
    if ( Vec_IntSize(vVec) & 1 )
        Vec_IntPush( p->vData, -1 );
    return Vec_IntSize(p->vMap) - 1;
}